

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,Pubkey *pubkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *this_00;
  string local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  HashUtil::Hash160((ByteData160 *)&local_48,parent_key);
  ByteData160::GetData((ByteData *)&local_68,(ByteData160 *)&local_48);
  ExtPubkey(this,network_type,(ByteData *)&local_68,pubkey,chain_code,depth,child_num);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  bVar1 = Pubkey::IsValid(parent_key);
  if (bVar1) {
    return;
  }
  local_68._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_68._M_string_length._0_4_ = 0x375;
  local_68.field_2._M_allocated_capacity = (long)"CfdCreateExtPubkey" + 9;
  logger::warn<>((CfdSourceLocation *)&local_68,"invalid pubkey.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_68,"Failed to pubkey. ExtPubkey invalid pubkey.",
             (allocator *)&local_48);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key, const Pubkey& pubkey,
    const ByteData256& chain_code, uint8_t depth, uint32_t child_num)
    : ExtPubkey(
          network_type, HashUtil::Hash160(parent_key).GetData(), pubkey,
          chain_code, depth, child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid pubkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to pubkey. ExtPubkey invalid pubkey.");
  }
}